

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

int vm_new_fn(VM *vm,int pkg_idx)

{
  int iVar1;
  Function *pFVar2;
  int iVar3;
  
  iVar3 = vm->fns_count;
  iVar1 = vm->fns_capacity;
  if (iVar3 < iVar1) {
    pFVar2 = vm->fns;
  }
  else {
    vm->fns_capacity = iVar1 * 2;
    pFVar2 = (Function *)realloc(vm->fns,(long)iVar1 * 0x30);
    vm->fns = pFVar2;
    iVar3 = vm->fns_count;
  }
  vm->fns_count = iVar3 + 1;
  pFVar2[iVar3].pkg = pkg_idx;
  pFVar2[iVar3].ins = (BcIns *)0x0;
  (&pFVar2[iVar3].ins)[1] = (BcIns *)0x0;
  return iVar3;
}

Assistant:

int vm_new_fn(VM *vm, int pkg_idx) {
	if (vm->fns_count >= vm->fns_capacity) {
		vm->fns_capacity *= 2;
		vm->fns = realloc(vm->fns, sizeof(Function) * vm->fns_capacity);
	}

	Function *fn = &vm->fns[vm->fns_count++];
	fn->pkg = pkg_idx;
	fn->ins = NULL; // Lazily instatiate the bytecode array
	fn->ins_count = 0;
	fn->ins_capacity = 0;
	return vm->fns_count - 1;
}